

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.c
# Opt level: O0

void nn_parse_options(nn_commandline *cline,void *target,int argc,char **argv)

{
  int iVar1;
  int local_84;
  undefined1 auStack_80 [4];
  int num_options;
  nn_parse_context ctx;
  char **argv_local;
  int argc_local;
  void *target_local;
  nn_commandline *cline_local;
  
  ctx.def = (nn_commandline *)cline->options;
  ctx.argv = (char **)(long)cline->required_options;
  local_84 = 0;
  while (((nn_option *)((long)ctx.def + (long)local_84 * 0x58))->longname != (char *)0x0) {
    local_84 = local_84 + 1;
  }
  _auStack_80 = cline;
  ctx.options = (nn_option *)target;
  ctx.target._0_4_ = argc;
  ctx._24_8_ = argv;
  ctx.last_option_usage = argv;
  ctx.data = (char *)calloc(8,(long)local_84);
  if (ctx.data == (char *)0x0) {
    nn_memory_error((nn_parse_context *)auStack_80);
  }
  ctx.requires = 0;
  ctx.mask._0_4_ = argc + -1;
  ctx._56_8_ = ctx.last_option_usage;
  nn_parse_arg0((nn_parse_context *)auStack_80);
  while( true ) {
    iVar1 = nn_get_arg((nn_parse_context *)auStack_80);
    if (iVar1 == 0) break;
    nn_parse_arg((nn_parse_context *)auStack_80);
  }
  nn_check_requires((nn_parse_context *)auStack_80);
  free(ctx.data);
  return;
}

Assistant:

void nn_parse_options (struct nn_commandline *cline,
    void *target, int argc, char **argv)
{
    struct nn_parse_context ctx;
    int num_options;

    ctx.def = cline;
    ctx.options = cline->options;
    ctx.target = target;
    ctx.argc = argc;
    ctx.argv = argv;
    ctx.requires = cline->required_options;

    for (num_options = 0; ctx.options[num_options].longname; ++num_options);
    ctx.last_option_usage = calloc (sizeof (char *), num_options);
    if  (!ctx.last_option_usage)
        nn_memory_error (&ctx);

    ctx.mask = 0;
    ctx.args_left = argc - 1;
    ctx.arg = argv;

    nn_parse_arg0 (&ctx);

    while (nn_get_arg (&ctx)) {
        nn_parse_arg (&ctx);
    }

    nn_check_requires (&ctx);

    free (ctx.last_option_usage);

}